

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_table_last(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  PS_Mask local_30;
  PS_Mask mask;
  FT_UInt count;
  FT_Error error;
  PS_Mask *amask_local;
  FT_Memory memory_local;
  PS_Mask_Table table_local;
  
  mask._4_4_ = 0;
  mask._0_4_ = table->num_masks;
  _count = amask;
  if ((uint)mask == 0) {
    amask_local = (PS_Mask *)memory;
    memory_local = (FT_Memory)table;
    mask._4_4_ = ps_mask_table_alloc(table,memory,&local_30);
  }
  else {
    local_30 = table->masks + ((ulong)(uint)mask - 1);
  }
  *_count = local_30;
  return mask._4_4_;
}

Assistant:

static FT_Error
  ps_mask_table_last( PS_Mask_Table  table,
                      FT_Memory      memory,
                      PS_Mask       *amask )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   count;
    PS_Mask   mask;


    count = table->num_masks;
    if ( count == 0 )
    {
      error = ps_mask_table_alloc( table, memory, &mask );
      if ( error )
        goto Exit;
    }
    else
      mask = table->masks + count - 1;

  Exit:
    *amask = mask;
    return error;
  }